

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O3

void __thiscall TestObject::ClearOne(TestObject *this)

{
  long lVar1;
  ulong uVar2;
  
  CheckCookie(this);
  if (0 < (long)this->pointerCount) {
    uVar2 = (ulong)((long)&this[2].size + 7U) & 0xffffffffffffffe0;
    lVar1 = 0;
    do {
      if (*(long *)(uVar2 + lVar1 * 8) != 0) {
        *(undefined8 *)(uVar2 + lVar1 * 8) = 0;
        return;
      }
      lVar1 = lVar1 + 1;
    } while (this->pointerCount != lVar1);
  }
  return;
}

Assistant:

void TestObject::ClearOne()
{
    CheckCookie();

    TestObject **data = GetDataPointer();

    for (int i = 0; i < pointerCount; ++i)
    {
        if (data[i] != nullptr/* && IsAligned<64>(data[i])*/)
        {
            // CreateFalseReferenceRandom(data[i]);
            data[i] = nullptr;
            break;
        }
    }
}